

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int Train(string *alphabetFile,string *datasetFile,string *resultModelFile)

{
  undefined1 local_120 [8];
  TLangModel model;
  
  NJamSpell::TLangModel::TLangModel((TLangModel *)local_120);
  NJamSpell::TLangModel::Train((TLangModel *)local_120,datasetFile,alphabetFile);
  NJamSpell::TLangModel::Dump((TLangModel *)local_120,resultModelFile);
  local_120 = (undefined1  [8])&PTR_Dump_00123960;
  NJamSpell::TPerfectHash::~TPerfectHash
            ((TPerfectHash *)
             &model.Buckets.
              super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (model.Tokenizer._64_8_ != 0) {
    operator_delete((void *)model.Tokenizer._64_8_);
  }
  model._128_8_ = &PTR_Dump_001239e8;
  std::locale::~locale((locale *)&model.Tokenizer.Alphabet._M_h._M_single_bucket);
  std::
  _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&model.Tokenizer);
  if (model.WordToId.
      super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      .m_ht._56_8_ != 0) {
    operator_delete((void *)model.WordToId.
                            super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                            .m_ht._56_8_);
  }
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
  ::~vector((vector<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
             *)&model.WordToId.
                super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           );
  return 0;
}

Assistant:

int Train(const std::string& alphabetFile,
          const std::string& datasetFile,
          const std::string& resultModelFile)
{
    TLangModel model;
    model.Train(datasetFile, alphabetFile);
    model.Dump(resultModelFile);
    return 0;
}